

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime_data.cpp
# Opt level: O1

void __thiscall ximu::DateTimeData::DateTimeData(DateTimeData *this,tm *t)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = t->tm_mon;
  iVar2 = t->tm_mday;
  iVar3 = t->tm_hour;
  iVar4 = t->tm_min;
  iVar5 = t->tm_sec;
  this->_year = (long)t->tm_year;
  this->_month = (long)iVar1;
  this->_day = (long)iVar2;
  this->_hours = (long)iVar3;
  this->_minutes = (long)iVar4;
  this->_seconds = (long)iVar5;
  return;
}

Assistant:

DateTimeData::DateTimeData(const std::tm& t)
    :
    DateTimeData(t.tm_year, t.tm_mon, t.tm_mday,
                 t.tm_hour, t.tm_min, t.tm_sec) {
}